

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O1

UINT8 nes_r_mame(void *chip,UINT8 offset)

{
  UINT8 UVar1;
  _Bool _Var2;
  UINT8 readVal;
  undefined8 uStack_18;
  
  if (offset < 0x20) {
    UVar1 = nes_apu_read(*(void **)((long)chip + 8),offset);
    return UVar1;
  }
  UVar1 = '\0';
  if ((*(void **)((long)chip + 0x18) != (void *)0x0) &&
     (UVar1 = '\0', *(char *)((long)chip + 0x28) == '\0')) {
    uStack_18 = chip;
    _Var2 = NES_FDS_Read(*(void **)((long)chip + 0x18),offset | 0x4000,
                         (UINT8 *)((long)&uStack_18 + 7));
    UVar1 = '\0';
    if (_Var2) {
      UVar1 = uStack_18._7_1_;
    }
  }
  return UVar1;
}

Assistant:

static UINT8 nes_r_mame(void* chip, UINT8 offset)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	
	if (offset < 0x20)	// NES APU
	{
		return nes_apu_read(info->chip_apu, offset);
	}
	else	// FDS
	{
#ifdef EC_NES_NSFP_FDS
		if (info->chip_fds != NULL && ! info->fds_disable)
			return nes_read_fds(info->chip_fds, offset);
#endif
		return 0x00;
	}
}